

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biattentional.cc
# Opt level: O3

void __thiscall
BidirAttentionalModel<dynet::LSTMBuilder>::initialise
          (BidirAttentionalModel<dynet::LSTMBuilder> *this,string *src_file,string *tgt_file,
          Model *model)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  const_iterator __begin2;
  ParameterStorage **p;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int iVar26;
  text_iarchive ia;
  Model tm;
  long *local_cb8;
  long *local_cb0;
  long *local_ca0;
  long *local_c98;
  Model sm;
  long *local_c30;
  long *local_c28;
  long *local_c18;
  long *local_c10;
  ifstream in;
  AttentionalModel<dynet::LSTMBuilder> tmb;
  AttentionalModel<dynet::LSTMBuilder> smb;
  
  dynet::Model::Model(&sm);
  dynet::Model::Model(&tm);
  dynet::AttentionalModel<dynet::LSTMBuilder>::AttentionalModel
            (&smb,&sm,VOCAB_SIZE_SRC,VOCAB_SIZE_TGT,LAYERS,HIDDEN_DIM,ALIGN_DIM,BIDIR,GIZA_P,GIZA_M,
             GIZA_F,DOC,FERT);
  dynet::AttentionalModel<dynet::LSTMBuilder>::AttentionalModel
            (&tmb,&tm,VOCAB_SIZE_TGT,VOCAB_SIZE_SRC,LAYERS,HIDDEN_DIM,ALIGN_DIM,BIDIR,GIZA_P,GIZA_M,
             GIZA_F,DOC,FERT);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"... loading ",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(src_file->_M_dataplus)._M_p,src_file->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ...",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::ifstream::ifstream(&in,(string *)src_file,_S_in);
  boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_dynet::Model>_>::
  get_instance();
  boost::archive::detail::basic_iarchive::load_object(&ia,(basic_iserializer *)&sm);
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&ia);
  boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
            ((basic_text_iprimitive<std::istream> *)&ia.field_0x28);
  std::ifstream::~ifstream(&in);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"... loading ",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(tgt_file->_M_dataplus)._M_p,tgt_file->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ...",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::ifstream::ifstream(&in,(string *)tgt_file,_S_in);
  boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_dynet::Model>_>::
  get_instance();
  boost::archive::detail::basic_iarchive::load_object(&ia,(basic_iserializer *)&tm);
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&ia);
  boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
            ((basic_text_iprimitive<std::istream> *)&ia.field_0x28);
  std::ifstream::~ifstream(&in);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"... merging parameters ...",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (*(long *)(model + 0x40) - *(long *)(model + 0x38) >> 3 !=
      (long)local_c10 - (long)local_c18 >> 2) {
    __assert_fail("lparams.size() == 2*sm.lookup_parameters_list().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                  ,0x6b,
                  "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
                 );
  }
  uVar11 = 0;
  if (local_c18 != local_c10) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      lVar8 = *(long *)(*local_c18 + 0x108);
      if (*(long *)(*local_c18 + 0x110) != lVar8) {
        uVar13 = 0;
        do {
          lVar9 = uVar13 * 0x58;
          uVar10 = (ulong)*(uint *)(lVar8 + 0x1c + lVar9);
          if (uVar10 == 0) {
            iVar26 = 1;
          }
          else {
            auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar19 = vpbroadcastq_avx512f();
            uVar12 = 0;
            do {
              auVar20 = vpbroadcastq_avx512f();
              auVar21 = vmovdqa64_avx512f(auVar18);
              auVar18 = vporq_avx512f(auVar20,auVar16);
              auVar20 = vporq_avx512f(auVar20,auVar17);
              uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
              bVar5 = (byte)uVar4;
              uVar4 = vpcmpuq_avx512f(auVar18,auVar19,2);
              bVar6 = (byte)uVar4;
              uVar14 = CONCAT11(bVar6,bVar5);
              auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(uVar13 * 0x58 + lVar8 + uVar12 * 4)
                                         );
              auVar20._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
              auVar20._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
              auVar20._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
              auVar20._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
              auVar20._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
              auVar20._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
              auVar20._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
              auVar20._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
              auVar20._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
              auVar20._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
              auVar20._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
              auVar20._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
              auVar20._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
              auVar20._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
              auVar20._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
              auVar20._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
              uVar12 = uVar12 + 0x10;
              auVar18 = vpmulld_avx512f(auVar20,auVar21);
            } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
            auVar16 = vmovdqa32_avx512f(auVar18);
            auVar17._0_4_ =
                 (uint)(bVar5 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
            bVar1 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar17._4_4_ = (uint)bVar1 * auVar16._4_4_ | (uint)!bVar1 * auVar21._4_4_;
            bVar1 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar17._8_4_ = (uint)bVar1 * auVar16._8_4_ | (uint)!bVar1 * auVar21._8_4_;
            bVar1 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar17._12_4_ = (uint)bVar1 * auVar16._12_4_ | (uint)!bVar1 * auVar21._12_4_;
            bVar1 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar17._16_4_ = (uint)bVar1 * auVar16._16_4_ | (uint)!bVar1 * auVar21._16_4_;
            bVar1 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar17._20_4_ = (uint)bVar1 * auVar16._20_4_ | (uint)!bVar1 * auVar21._20_4_;
            bVar1 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar17._24_4_ = (uint)bVar1 * auVar16._24_4_ | (uint)!bVar1 * auVar21._24_4_;
            bVar1 = (bool)((byte)(uVar14 >> 7) & 1);
            auVar17._28_4_ = (uint)bVar1 * auVar16._28_4_ | (uint)!bVar1 * auVar21._28_4_;
            auVar17._32_4_ =
                 (uint)(bVar6 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
            bVar1 = (bool)(bVar6 >> 1 & 1);
            auVar17._36_4_ = (uint)bVar1 * auVar16._36_4_ | (uint)!bVar1 * auVar21._36_4_;
            bVar1 = (bool)(bVar6 >> 2 & 1);
            auVar17._40_4_ = (uint)bVar1 * auVar16._40_4_ | (uint)!bVar1 * auVar21._40_4_;
            bVar1 = (bool)(bVar6 >> 3 & 1);
            auVar17._44_4_ = (uint)bVar1 * auVar16._44_4_ | (uint)!bVar1 * auVar21._44_4_;
            bVar1 = (bool)(bVar6 >> 4 & 1);
            auVar17._48_4_ = (uint)bVar1 * auVar16._48_4_ | (uint)!bVar1 * auVar21._48_4_;
            bVar1 = (bool)(bVar6 >> 5 & 1);
            auVar17._52_4_ = (uint)bVar1 * auVar16._52_4_ | (uint)!bVar1 * auVar21._52_4_;
            bVar1 = (bool)(bVar6 >> 6 & 1);
            auVar17._56_4_ = (uint)bVar1 * auVar16._56_4_ | (uint)!bVar1 * auVar21._56_4_;
            auVar17._60_4_ =
                 (uint)(bVar6 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
            auVar15 = vextracti64x4_avx512f(auVar17,1);
            auVar16 = vpmulld_avx512f(auVar17,ZEXT3264(auVar15));
            auVar2 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
            auVar3 = vpshufd_avx(auVar2,0xee);
            auVar2 = vpmulld_avx(auVar2,auVar3);
            auVar3 = vpshufd_avx(auVar2,0x55);
            auVar2 = vpmulld_avx(auVar2,auVar3);
            iVar26 = auVar2._0_4_;
          }
          memcpy(*(void **)(*(long *)(*(long *)(*(long *)(model + 0x38) + uVar11 * 8) + 0x108) +
                            0x28 + lVar9),*(void **)(lVar8 + 0x28 + lVar9),
                 (ulong)(uint)(iVar26 * *(int *)(lVar8 + lVar9 + 0x20)) << 2);
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          uVar13 = (ulong)((int)uVar13 + 1);
          lVar8 = *(long *)(*local_c18 + 0x108);
          uVar10 = (*(long *)(*local_c18 + 0x110) - lVar8 >> 3) * 0x2e8ba2e8ba2e8ba3;
        } while (uVar13 <= uVar10 && uVar10 - uVar13 != 0);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      local_c18 = local_c18 + 1;
    } while (local_c18 != local_c10);
  }
  if (local_ca0 != local_c98) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      lVar8 = *(long *)(*local_ca0 + 0x108);
      if (*(long *)(*local_ca0 + 0x110) != lVar8) {
        uVar13 = 0;
        do {
          lVar9 = uVar13 * 0x58;
          uVar10 = (ulong)*(uint *)(lVar8 + 0x1c + lVar9);
          if (uVar10 == 0) {
            iVar26 = 1;
          }
          else {
            auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar19 = vpbroadcastq_avx512f();
            uVar12 = 0;
            do {
              auVar20 = vpbroadcastq_avx512f();
              auVar21 = vmovdqa64_avx512f(auVar18);
              auVar18 = vporq_avx512f(auVar20,auVar16);
              auVar20 = vporq_avx512f(auVar20,auVar17);
              uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
              bVar5 = (byte)uVar4;
              uVar4 = vpcmpuq_avx512f(auVar18,auVar19,2);
              bVar6 = (byte)uVar4;
              uVar14 = CONCAT11(bVar6,bVar5);
              auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(uVar13 * 0x58 + lVar8 + uVar12 * 4)
                                         );
              auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
              auVar22._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
              auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
              auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
              auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
              auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
              auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
              auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
              auVar22._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
              auVar22._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
              auVar22._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
              auVar22._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
              auVar22._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
              auVar22._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
              auVar22._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
              auVar22._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
              uVar12 = uVar12 + 0x10;
              auVar18 = vpmulld_avx512f(auVar22,auVar21);
            } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
            auVar16 = vmovdqa32_avx512f(auVar18);
            auVar18._0_4_ =
                 (uint)(bVar5 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
            bVar1 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar18._4_4_ = (uint)bVar1 * auVar16._4_4_ | (uint)!bVar1 * auVar21._4_4_;
            bVar1 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar18._8_4_ = (uint)bVar1 * auVar16._8_4_ | (uint)!bVar1 * auVar21._8_4_;
            bVar1 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar18._12_4_ = (uint)bVar1 * auVar16._12_4_ | (uint)!bVar1 * auVar21._12_4_;
            bVar1 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar18._16_4_ = (uint)bVar1 * auVar16._16_4_ | (uint)!bVar1 * auVar21._16_4_;
            bVar1 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar18._20_4_ = (uint)bVar1 * auVar16._20_4_ | (uint)!bVar1 * auVar21._20_4_;
            bVar1 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar18._24_4_ = (uint)bVar1 * auVar16._24_4_ | (uint)!bVar1 * auVar21._24_4_;
            bVar1 = (bool)((byte)(uVar14 >> 7) & 1);
            auVar18._28_4_ = (uint)bVar1 * auVar16._28_4_ | (uint)!bVar1 * auVar21._28_4_;
            auVar18._32_4_ =
                 (uint)(bVar6 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
            bVar1 = (bool)(bVar6 >> 1 & 1);
            auVar18._36_4_ = (uint)bVar1 * auVar16._36_4_ | (uint)!bVar1 * auVar21._36_4_;
            bVar1 = (bool)(bVar6 >> 2 & 1);
            auVar18._40_4_ = (uint)bVar1 * auVar16._40_4_ | (uint)!bVar1 * auVar21._40_4_;
            bVar1 = (bool)(bVar6 >> 3 & 1);
            auVar18._44_4_ = (uint)bVar1 * auVar16._44_4_ | (uint)!bVar1 * auVar21._44_4_;
            bVar1 = (bool)(bVar6 >> 4 & 1);
            auVar18._48_4_ = (uint)bVar1 * auVar16._48_4_ | (uint)!bVar1 * auVar21._48_4_;
            bVar1 = (bool)(bVar6 >> 5 & 1);
            auVar18._52_4_ = (uint)bVar1 * auVar16._52_4_ | (uint)!bVar1 * auVar21._52_4_;
            bVar1 = (bool)(bVar6 >> 6 & 1);
            auVar18._56_4_ = (uint)bVar1 * auVar16._56_4_ | (uint)!bVar1 * auVar21._56_4_;
            auVar18._60_4_ =
                 (uint)(bVar6 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
            auVar15 = vextracti64x4_avx512f(auVar18,1);
            auVar16 = vpmulld_avx512f(auVar18,ZEXT3264(auVar15));
            auVar2 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
            auVar3 = vpshufd_avx(auVar2,0xee);
            auVar2 = vpmulld_avx(auVar2,auVar3);
            auVar3 = vpshufd_avx(auVar2,0x55);
            auVar2 = vpmulld_avx(auVar2,auVar3);
            iVar26 = auVar2._0_4_;
          }
          memcpy(*(void **)(*(long *)(*(long *)(*(long *)(model + 0x38) + uVar11 * 8) + 0x108) +
                            0x28 + lVar9),*(void **)(lVar8 + 0x28 + lVar9),
                 (ulong)(uint)(iVar26 * *(int *)(lVar8 + lVar9 + 0x20)) << 2);
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          uVar13 = (ulong)((int)uVar13 + 1);
          lVar8 = *(long *)(*local_ca0 + 0x108);
          uVar10 = (*(long *)(*local_ca0 + 0x110) - lVar8 >> 3) * 0x2e8ba2e8ba2e8ba3;
        } while (uVar13 <= uVar10 && uVar10 - uVar13 != 0);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      local_ca0 = local_ca0 + 1;
    } while (local_ca0 != local_c98);
  }
  if (*(long *)(model + 0x40) - *(long *)(model + 0x38) >> 3 != uVar11) {
    __assert_fail("lid == lparams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                  ,0x76,
                  "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
                 );
  }
  uVar11 = 0;
  if (local_c30 != local_c28) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar13 = uVar11;
    do {
      lVar8 = *local_c30;
      if ((ulong)*(uint *)(lVar8 + 0x4c) == 0) {
        iVar26 = 1;
      }
      else {
        auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar19 = vpbroadcastq_avx512f();
        uVar11 = 0;
        do {
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vmovdqa64_avx512f(auVar18);
          auVar18 = vporq_avx512f(auVar20,auVar16);
          auVar20 = vporq_avx512f(auVar20,auVar17);
          uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
          bVar5 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar18,auVar19,2);
          bVar6 = (byte)uVar4;
          uVar14 = CONCAT11(bVar6,bVar5);
          auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar8 + 0x30 + uVar11 * 4));
          auVar23._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
          auVar23._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
          auVar23._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
          auVar23._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
          auVar23._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
          auVar23._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
          auVar23._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
          auVar23._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
          auVar23._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
          auVar23._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
          auVar23._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
          auVar23._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
          auVar23._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
          auVar23._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
          auVar23._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
          auVar23._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
          uVar11 = uVar11 + 0x10;
          auVar18 = vpmulld_avx512f(auVar23,auVar21);
        } while (((ulong)*(uint *)(lVar8 + 0x4c) + 0xf & 0x1fffffff0) != uVar11);
        auVar16 = vmovdqa32_avx512f(auVar18);
        auVar19._0_4_ = (uint)(bVar5 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_
        ;
        bVar1 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar19._4_4_ = (uint)bVar1 * auVar16._4_4_ | (uint)!bVar1 * auVar21._4_4_;
        bVar1 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar19._8_4_ = (uint)bVar1 * auVar16._8_4_ | (uint)!bVar1 * auVar21._8_4_;
        bVar1 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar19._12_4_ = (uint)bVar1 * auVar16._12_4_ | (uint)!bVar1 * auVar21._12_4_;
        bVar1 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar19._16_4_ = (uint)bVar1 * auVar16._16_4_ | (uint)!bVar1 * auVar21._16_4_;
        bVar1 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar19._20_4_ = (uint)bVar1 * auVar16._20_4_ | (uint)!bVar1 * auVar21._20_4_;
        bVar1 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar19._24_4_ = (uint)bVar1 * auVar16._24_4_ | (uint)!bVar1 * auVar21._24_4_;
        bVar1 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar19._28_4_ = (uint)bVar1 * auVar16._28_4_ | (uint)!bVar1 * auVar21._28_4_;
        auVar19._32_4_ =
             (uint)(bVar6 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
        bVar1 = (bool)(bVar6 >> 1 & 1);
        auVar19._36_4_ = (uint)bVar1 * auVar16._36_4_ | (uint)!bVar1 * auVar21._36_4_;
        bVar1 = (bool)(bVar6 >> 2 & 1);
        auVar19._40_4_ = (uint)bVar1 * auVar16._40_4_ | (uint)!bVar1 * auVar21._40_4_;
        bVar1 = (bool)(bVar6 >> 3 & 1);
        auVar19._44_4_ = (uint)bVar1 * auVar16._44_4_ | (uint)!bVar1 * auVar21._44_4_;
        bVar1 = (bool)(bVar6 >> 4 & 1);
        auVar19._48_4_ = (uint)bVar1 * auVar16._48_4_ | (uint)!bVar1 * auVar21._48_4_;
        bVar1 = (bool)(bVar6 >> 5 & 1);
        auVar19._52_4_ = (uint)bVar1 * auVar16._52_4_ | (uint)!bVar1 * auVar21._52_4_;
        bVar1 = (bool)(bVar6 >> 6 & 1);
        auVar19._56_4_ = (uint)bVar1 * auVar16._56_4_ | (uint)!bVar1 * auVar21._56_4_;
        auVar19._60_4_ =
             (uint)(bVar6 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar19,1);
        auVar16 = vpmulld_avx512f(auVar19,ZEXT3264(auVar15));
        auVar2 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpmulld_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpmulld_avx(auVar2,auVar3);
        iVar26 = auVar2._0_4_;
      }
      uVar11 = (ulong)((int)uVar13 + 1);
      memcpy(*(void **)(*(long *)(*(long *)(model + 0x20) + uVar13 * 8) + 0x58),
             *(void **)(lVar8 + 0x58),(ulong)(uint)(iVar26 * *(int *)(lVar8 + 0x50)) << 2);
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_c30 = local_c30 + 1;
      uVar13 = uVar11;
    } while (local_c30 != local_c28);
  }
  if (local_cb8 != local_cb0) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar13 = uVar11;
    do {
      lVar8 = *local_cb8;
      if ((ulong)*(uint *)(lVar8 + 0x4c) == 0) {
        iVar26 = 1;
      }
      else {
        auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar19 = vpbroadcastq_avx512f();
        uVar11 = 0;
        do {
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vmovdqa64_avx512f(auVar18);
          auVar18 = vporq_avx512f(auVar20,auVar16);
          auVar20 = vporq_avx512f(auVar20,auVar17);
          uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
          bVar5 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar18,auVar19,2);
          bVar6 = (byte)uVar4;
          uVar14 = CONCAT11(bVar6,bVar5);
          auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar8 + 0x30 + uVar11 * 4));
          auVar24._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
          auVar24._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
          auVar24._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
          auVar24._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
          auVar24._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
          auVar24._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
          auVar24._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
          auVar24._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
          auVar24._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
          auVar24._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
          auVar24._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
          auVar24._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
          auVar24._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
          auVar24._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
          auVar24._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
          auVar24._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
          uVar11 = uVar11 + 0x10;
          auVar18 = vpmulld_avx512f(auVar24,auVar21);
        } while (((ulong)*(uint *)(lVar8 + 0x4c) + 0xf & 0x1fffffff0) != uVar11);
        auVar16 = vmovdqa32_avx512f(auVar18);
        auVar25._0_4_ = (uint)(bVar5 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_
        ;
        bVar1 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar1 * auVar16._4_4_ | (uint)!bVar1 * auVar21._4_4_;
        bVar1 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar1 * auVar16._8_4_ | (uint)!bVar1 * auVar21._8_4_;
        bVar1 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar1 * auVar16._12_4_ | (uint)!bVar1 * auVar21._12_4_;
        bVar1 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar25._16_4_ = (uint)bVar1 * auVar16._16_4_ | (uint)!bVar1 * auVar21._16_4_;
        bVar1 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar25._20_4_ = (uint)bVar1 * auVar16._20_4_ | (uint)!bVar1 * auVar21._20_4_;
        bVar1 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar25._24_4_ = (uint)bVar1 * auVar16._24_4_ | (uint)!bVar1 * auVar21._24_4_;
        bVar1 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar25._28_4_ = (uint)bVar1 * auVar16._28_4_ | (uint)!bVar1 * auVar21._28_4_;
        auVar25._32_4_ =
             (uint)(bVar6 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
        bVar1 = (bool)(bVar6 >> 1 & 1);
        auVar25._36_4_ = (uint)bVar1 * auVar16._36_4_ | (uint)!bVar1 * auVar21._36_4_;
        bVar1 = (bool)(bVar6 >> 2 & 1);
        auVar25._40_4_ = (uint)bVar1 * auVar16._40_4_ | (uint)!bVar1 * auVar21._40_4_;
        bVar1 = (bool)(bVar6 >> 3 & 1);
        auVar25._44_4_ = (uint)bVar1 * auVar16._44_4_ | (uint)!bVar1 * auVar21._44_4_;
        bVar1 = (bool)(bVar6 >> 4 & 1);
        auVar25._48_4_ = (uint)bVar1 * auVar16._48_4_ | (uint)!bVar1 * auVar21._48_4_;
        bVar1 = (bool)(bVar6 >> 5 & 1);
        auVar25._52_4_ = (uint)bVar1 * auVar16._52_4_ | (uint)!bVar1 * auVar21._52_4_;
        bVar1 = (bool)(bVar6 >> 6 & 1);
        auVar25._56_4_ = (uint)bVar1 * auVar16._56_4_ | (uint)!bVar1 * auVar21._56_4_;
        auVar25._60_4_ =
             (uint)(bVar6 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar25,1);
        auVar16 = vpmulld_avx512f(auVar25,ZEXT3264(auVar15));
        auVar2 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpmulld_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpmulld_avx(auVar2,auVar3);
        iVar26 = auVar2._0_4_;
      }
      uVar11 = (ulong)((int)uVar13 + 1);
      memcpy(*(void **)(*(long *)(*(long *)(model + 0x20) + uVar13 * 8) + 0x58),
             *(void **)(lVar8 + 0x58),(ulong)(uint)(iVar26 * *(int *)(lVar8 + 0x50)) << 2);
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_cb8 = local_cb8 + 1;
      uVar13 = uVar11;
    } while (local_cb8 != local_cb0);
  }
  if (*(long *)(model + 0x28) - *(long *)(model + 0x20) >> 3 != uVar11) {
    __assert_fail("did == dparams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                  ,0x7e,
                  "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
                 );
  }
  dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel(&tmb);
  dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel(&smb);
  dynet::Model::~Model(&tm);
  dynet::Model::~Model(&sm);
  return;
}

Assistant:

void initialise(const std::string &src_file, const std::string &tgt_file, Model &model)
    {
	Model sm, tm;
	AttentionalModel<Builder> smb(&sm, VOCAB_SIZE_SRC, VOCAB_SIZE_TGT, 
		LAYERS, HIDDEN_DIM, ALIGN_DIM, BIDIR, GIZA_P, GIZA_M, GIZA_F, DOC, FERT);
	AttentionalModel<Builder> tmb(&tm, VOCAB_SIZE_TGT, VOCAB_SIZE_SRC,
		LAYERS, HIDDEN_DIM, ALIGN_DIM, BIDIR, GIZA_P, GIZA_M, GIZA_F, DOC, FERT);

	//for (const auto &p : sm.lookup_parameters_list())  
            //std::cerr << "\tlookup size: " << p->values[0].d << " number: " << p->values.size() << std::endl;
	//for (const auto &p : sm.parameters_list())  
            //std::cerr << "\tparam size: " << p->values.d << std::endl;

        std::cerr << "... loading " << src_file << " ..." << std::endl;
	{
	    ifstream in(src_file);
	    boost::archive::text_iarchive ia(in);
	    ia >> sm;
	}

        std::cerr << "... loading " << tgt_file << " ..." << std::endl;
	{
	    ifstream in(tgt_file);
	    boost::archive::text_iarchive ia(in);
	    ia >> tm;
	}
        std::cerr << "... merging parameters ..." << std::endl;

	unsigned lid = 0;
	auto &lparams = model.lookup_parameters_list();
	assert(lparams.size() == 2*sm.lookup_parameters_list().size());
	for (const auto &p : sm.lookup_parameters_list())  {
	    for (unsigned i = 0; i < p->values.size(); ++i) 
		memcpy(lparams[lid]->values[i].v, &p->values[i].v[0], sizeof(dynet::real) * p->values[i].d.size());
	    lid++;
	}
	for (const auto &p : tm.lookup_parameters_list()) {
	    for (unsigned i = 0; i < p->values.size(); ++i) 
		memcpy(lparams[lid]->values[i].v, &p->values[i].v[0], sizeof(dynet::real) * p->values[i].d.size());
	    lid++;
	}
	assert(lid == lparams.size());

	unsigned did = 0;
	auto &dparams = model.parameters_list();
	for (const auto &p : sm.parameters_list()) 
	    memcpy(dparams[did++]->values.v, &p->values.v[0], sizeof(dynet::real) * p->values.d.size());
	for (const auto &p : tm.parameters_list()) 
	    memcpy(dparams[did++]->values.v, &p->values.v[0], sizeof(dynet::real) * p->values.d.size());
	assert(did == dparams.size());
    }